

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# interpreter.cpp
# Opt level: O3

void __thiscall
mjs::interpreter::impl::force_global_scope::force_global_scope(force_global_scope *this,impl *i)

{
  gc_heap *this_00;
  gc_heap_ptr_untyped local_48;
  undefined1 local_38 [24];
  uint32_t local_20;
  
  this->parent_ = i;
  this_00 = (i->active_scope_).super_gc_heap_ptr_untyped.heap_;
  (this->old_scope_).super_gc_heap_ptr_untyped.heap_ = this_00;
  (this->old_scope_).super_gc_heap_ptr_untyped.pos_ =
       (i->active_scope_).super_gc_heap_ptr_untyped.pos_;
  if (this_00 != (gc_heap *)0x0) {
    gc_heap::attach(this_00,&(this->old_scope_).super_gc_heap_ptr_untyped);
  }
  local_48.heap_ = (i->global_).super_gc_heap_ptr_untyped.heap_;
  local_48.pos_ = (i->global_).super_gc_heap_ptr_untyped.pos_;
  gc_heap::attach(local_48.heap_,&local_48);
  local_38._16_8_ = (slot *)0x0;
  local_20 = 0;
  gc_heap::
  allocate_and_construct<mjs::interpreter::impl::scope,mjs::gc_heap_ptr<mjs::object>const&,mjs::gc_heap_ptr<mjs::interpreter::impl::scope>const&>
            ((gc_heap *)local_38,(size_t)local_48.heap_,(gc_heap_ptr<mjs::object> *)0x18,
             (gc_heap_ptr<mjs::interpreter::impl::scope> *)&local_48);
  gc_heap_ptr_untyped::operator=
            (&(this->parent_->active_scope_).super_gc_heap_ptr_untyped,
             (gc_heap_ptr_untyped *)local_38);
  gc_heap_ptr_untyped::~gc_heap_ptr_untyped((gc_heap_ptr_untyped *)local_38);
  gc_heap_ptr_untyped::~gc_heap_ptr_untyped((gc_heap_ptr_untyped *)(local_38 + 0x10));
  gc_heap_ptr_untyped::~gc_heap_ptr_untyped(&local_48);
  return;
}

Assistant:

explicit force_global_scope(impl& i) : parent_(i), old_scope_(parent_.active_scope_) {
            parent_.active_scope_ = make_scope(i.global_, nullptr);
        }